

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequence.cpp
# Opt level: O2

Sequence * __thiscall Sequence::operator=(Sequence *this,uint64_t seq)

{
  size_type sVar1;
  uint *puVar2;
  ulong __n;
  ulong uVar3;
  
  sVar1 = std::deque<int,_std::allocator<int>_>::size(&this->m_bits);
  __n = 0;
  uVar3 = sVar1 & 0xffffffff;
  if ((int)sVar1 < 1) {
    uVar3 = __n;
  }
  for (; uVar3 != __n; __n = __n + 1) {
    puVar2 = (uint *)std::_Deque_iterator<int,_int_&,_int_*>::operator[]
                               (&(this->m_bits).super__Deque_base<int,_std::allocator<int>_>._M_impl
                                 .super__Deque_impl_data._M_start,__n);
    *puVar2 = (uint)((seq >> (__n & 0x3f) & 1) != 0);
  }
  return this;
}

Assistant:

Sequence &Sequence::operator=(uint64_t seq) {
    auto n = size();
    for (auto i = 0; i < n; ++i) {
        m_bits[i] = (seq >> i) & 1;
    }
    return *this;
}